

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void prvTidyFreeDeclaredTags(TidyDocImpl *doc,UserTagType tagType)

{
  Dict *pDVar1;
  bool bVar2;
  Dict *pDStack_38;
  Bool deleteIt;
  Dict *prev;
  Dict *next;
  Dict *curr;
  TidyTagImpl *tags;
  UserTagType tagType_local;
  TidyDocImpl *doc_local;
  
  pDStack_38 = (Dict *)0x0;
  next = (doc->tags).declared_tag_list;
  while (next != (Dict *)0x0) {
    bVar2 = true;
    pDVar1 = next->next;
    switch(tagType) {
    case tagtype_null:
      break;
    case tagtype_empty:
      bVar2 = (next->model & 1) != 0;
      break;
    case tagtype_inline:
      bVar2 = (next->model & 0x10) != 0;
      break;
    case tagtype_block:
      bVar2 = false;
      if ((next->model & 8) != 0) {
        bVar2 = next->parser == prvTidyParseBlock;
      }
      break;
    case tagtype_pre:
      bVar2 = false;
      if ((next->model & 8) != 0) {
        bVar2 = next->parser == prvTidyParsePre;
      }
    }
    if (bVar2) {
      tagsRemoveFromHash(doc,&doc->tags,next->name);
      FreeDict(doc,next);
      if (pDStack_38 == (Dict *)0x0) {
        (doc->tags).declared_tag_list = pDVar1;
        next = pDVar1;
      }
      else {
        pDStack_38->next = pDVar1;
        next = pDVar1;
      }
    }
    else {
      pDStack_38 = next;
      next = pDVar1;
    }
  }
  return;
}

Assistant:

void TY_(FreeDeclaredTags)( TidyDocImpl* doc, UserTagType tagType )
{
    TidyTagImpl* tags = &doc->tags;
    Dict *curr, *next = NULL, *prev = NULL;

    for ( curr=tags->declared_tag_list; curr; curr = next )
    {
        Bool deleteIt = yes;
        next = curr->next;
        switch ( tagType )
        {
        case tagtype_empty:
            deleteIt = ( curr->model & CM_EMPTY ) != 0;
            break;

        case tagtype_inline:
            deleteIt = ( curr->model & CM_INLINE ) != 0;
            break;

        case tagtype_block:
            deleteIt = ( (curr->model & CM_BLOCK) != 0 &&
                         curr->parser == TY_(ParseBlock) );
            break;

        case tagtype_pre:
            deleteIt = ( (curr->model & CM_BLOCK) != 0 &&
                         curr->parser == TY_(ParsePre) );
            break;

        case tagtype_null:
            break;
        }

        if ( deleteIt )
        {
          tagsRemoveFromHash( doc, &doc->tags, curr->name );
          FreeDict( doc, curr );
          if ( prev )
            prev->next = next;
          else
            tags->declared_tag_list = next;
        }
        else
          prev = curr;
    }
}